

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

void __thiscall
Js::EntryPointInfo::EntryPointInfo
          (EntryPointInfo *this,JavascriptMethod method,JavascriptLibrary *library,
          ThreadContext *context,bool isLoopBody)

{
  nullptr_t local_50;
  nullptr_t local_48;
  nullptr_t local_40;
  nullptr_t local_38;
  byte local_29;
  ThreadContext *pTStack_28;
  bool isLoopBody_local;
  ThreadContext *context_local;
  JavascriptLibrary *library_local;
  JavascriptMethod method_local;
  EntryPointInfo *this_local;
  
  local_29 = isLoopBody;
  pTStack_28 = context;
  context_local = (ThreadContext *)library;
  library_local = (JavascriptLibrary *)method;
  method_local = (JavascriptMethod)this;
  ProxyEntryPointInfo::ProxyEntryPointInfo(&this->super_ProxyEntryPointInfo,method,context);
  (this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01de0770;
  this->field_0x18 = this->field_0x18 & 0xfe | 1;
  this->field_0x18 = this->field_0x18 & 0xfd | (local_29 & 1) << 1;
  this->field_0x18 = this->field_0x18 & 0xfb;
  this->field_0x18 = this->field_0x18 & 0xf7;
  this->field_0x18 = this->field_0x18 & 0xef;
  this->field_0x18 = this->field_0x18 & 0xdf;
  this->state = NotScheduled;
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<NativeEntryPointData>::WriteBarrierPtr
            (&this->nativeEntryPointData,&local_38);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<CodeGenWorkItem>::WriteBarrierPtr(&this->workItem,&local_40);
  Memory::WriteBarrierPtr<Js::JavascriptLibrary>::WriteBarrierPtr
            (&this->library,(JavascriptLibrary *)context_local);
  this->cleanupStack = (Type)0x0;
  this->cleanupReason = NotCleanedUp;
  local_48 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::FieldAccessStats>::WriteBarrierPtr(&this->fieldAccessStats,&local_48);
  local_50 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<const_unsigned_char>::WriteBarrierPtr(&this->serializedRpcData,&local_50);
  this->serializedRpcDataSize = 0;
  return;
}

Assistant:

EntryPointInfo(Js::JavascriptMethod method, JavascriptLibrary* library, ThreadContext* context = nullptr, bool isLoopBody = false) :
            ProxyEntryPointInfo(method, context), tag(1), nativeEntryPointProcessed(false), mIsTemplatizedJitMode(false),
#if ENABLE_NATIVE_CODEGEN
            nativeEntryPointData(nullptr), workItem(nullptr), state(NotScheduled),
            isLoopBody(isLoopBody), hasJittedStackClosure(false),
#endif
            library(library), isAsmJsFunction(false)
#if ENABLE_ENTRYPOINT_CLEANUP_TRACE
#if ENABLE_DEBUG_STACK_BACK_TRACE
            , cleanupStack(nullptr)
#endif
            , cleanupReason(NotCleanedUp)
#endif
#ifdef FIELD_ACCESS_STATS
            , fieldAccessStats(nullptr)
#endif
        {}